

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chat.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  char *pcVar1;
  DashelException *e;
  ChatServer server;
  string local_120;
  allocator<char> local_e9;
  string local_e8;
  undefined1 local_c8 [8];
  ChatClient client;
  char **argv_local;
  int argc_local;
  
  client.nick.field_2._8_8_ = argv;
  if (argc < 3) {
    ChatServer::ChatServer((ChatServer *)&e);
    Dashel::Hub::run();
    ChatServer::~ChatServer((ChatServer *)&e);
  }
  else {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_e8,pcVar1,&local_e9);
    pcVar1 = *(char **)(client.nick.field_2._8_8_ + 0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_120,pcVar1,
               (allocator<char> *)
               ((long)&server.nicks._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    ChatClient::ChatClient((ChatClient *)local_c8,&local_e8,&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&server.nicks._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
    std::__cxx11::string::~string((string *)&local_e8);
    std::allocator<char>::~allocator(&local_e9);
    Dashel::Hub::run();
    ChatClient::~ChatClient((ChatClient *)local_c8);
  }
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	try
	{
		if (argc > 2)
		{
			ChatClient client(argv[1], argv[2]);
			client.run();
		}
		else
		{
			ChatServer server;
			server.run();
		}
	}
	catch (const DashelException& e)
	{
		std::cerr << e.what() << std::endl;
	}

	return 0;
}